

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool character_equip_twoslot
               (Character *character,short item,uchar subloc,EquipLocation slot1,EquipLocation slot2
               )

{
  reference pvVar1;
  EquipLocation slot2_local;
  EquipLocation slot1_local;
  uchar subloc_local;
  short item_local;
  Character *character_local;
  
  if (subloc == '\0') {
    pvVar1 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot1);
    if (*pvVar1 != 0) {
      return false;
    }
    pvVar1 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot1);
    *pvVar1 = (int)item;
    Character::DelItem(character,item,1);
  }
  else {
    pvVar1 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot2);
    if (*pvVar1 != 0) {
      return false;
    }
    pvVar1 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot2);
    *pvVar1 = (int)item;
    Character::DelItem(character,item,1);
  }
  Character::CalculateStats(character,true);
  return true;
}

Assistant:

static bool character_equip_twoslot(Character *character, short item, unsigned char subloc, Character::EquipLocation slot1, Character::EquipLocation slot2)
{
	if (subloc == 0)
	{
		if (character->paperdoll[slot1] != 0)
		{
			return false;
		}

		character->paperdoll[slot1] = item;
		character->DelItem(item, 1);
	}
	else
	{
		if (character->paperdoll[slot2] != 0)
		{
			return false;
		}

		character->paperdoll[slot2] = item;
		character->DelItem(item, 1);
	}

	character->CalculateStats();
	return true;
}